

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_quaff(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *in_RDI;
  int nDelay;
  OBJ_DATA *obj;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffecd8;
  RString *in_stack_ffffffffffffece0;
  CHAR_DATA *in_stack_ffffffffffffece8;
  char_data *in_stack_ffffffffffffecf0;
  undefined4 in_stack_ffffffffffffed00;
  undefined4 in_stack_ffffffffffffed04;
  allocator<char> *in_stack_ffffffffffffed10;
  allocator<char> *__a;
  undefined4 in_stack_ffffffffffffed18;
  undefined4 in_stack_ffffffffffffed1c;
  undefined4 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_12d1;
  string local_12d0 [39];
  allocator<char> local_12a9;
  string local_12a8 [39];
  allocator<char> local_1281;
  string local_1280 [55];
  undefined1 local_1249 [37];
  undefined4 local_1224;
  OBJ_DATA *local_1220;
  char local_1218;
  char_data **in_stack_ffffffffffffee28;
  _func_void_char_data_ptr_int_int_int_int *in_stack_ffffffffffffee30;
  string *in_stack_ffffffffffffee38;
  string *in_stack_ffffffffffffee40;
  int in_stack_ffffffffffffee4c;
  CQueue *in_stack_ffffffffffffee50;
  int *in_stack_ffffffffffffee60;
  int *in_stack_ffffffffffffee68;
  int *in_stack_ffffffffffffee70;
  int *in_stack_ffffffffffffee78;
  CHAR_DATA *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  CHAR_DATA *in_stack_fffffffffffffef8;
  
  local_1224 = 0;
  one_argument((char *)in_stack_ffffffffffffece0,(char *)in_stack_ffffffffffffecd8);
  bVar1 = is_npc(in_stack_ffffffffffffecd8);
  if (bVar1) {
LAB_00579713:
    local_1224 = 2;
  }
  else {
    char_data::Class(in_stack_ffffffffffffecf0);
    bVar1 = RString::operator==(in_stack_ffffffffffffece0,(char *)in_stack_ffffffffffffecd8);
    if (!bVar1) {
      char_data::Class(in_stack_ffffffffffffecf0);
      bVar1 = RString::operator==(in_stack_ffffffffffffece0,(char *)in_stack_ffffffffffffecd8);
      if (!bVar1) {
        char_data::Class(in_stack_ffffffffffffecf0);
        bVar1 = RString::operator==(in_stack_ffffffffffffece0,(char *)in_stack_ffffffffffffecd8);
        if (!bVar1) goto LAB_00579713;
      }
    }
    local_1224 = 1;
  }
  if (local_1218 == '\0') {
    local_1220 = get_eq_char(in_RDI,0x11);
    if ((local_1220 == (OBJ_DATA *)0x0) || (local_1220->item_type != 10)) {
      send_to_char((char *)in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8);
    }
    else {
      act((char *)in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8,in_stack_ffffffffffffece0,
          in_stack_ffffffffffffecd8,0);
      act((char *)in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8,in_stack_ffffffffffffece0,
          in_stack_ffffffffffffecd8,0);
      bVar1 = check_deny_magic(in_stack_ffffffffffffecd8);
      if (!bVar1) {
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1249;
        uVar2 = local_1224;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)CONCAT44(uVar2,in_stack_ffffffffffffed18),in_stack_ffffffffffffed10)
        ;
        __a = &local_1281;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)CONCAT44(uVar2,in_stack_ffffffffffffed18),__a);
        CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>
                  (in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c,in_stack_ffffffffffffee40,
                   in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,
                   in_stack_ffffffffffffee60,in_stack_ffffffffffffee68,in_stack_ffffffffffffee70,
                   in_stack_ffffffffffffee78);
        std::__cxx11::string::~string(local_1280);
        std::allocator<char>::~allocator(&local_1281);
        std::__cxx11::string::~string((string *)(local_1249 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1249);
      }
      extract_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00));
    }
  }
  else {
    local_1220 = get_obj_carry(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                               in_stack_fffffffffffffee8);
    if (local_1220 == (OBJ_DATA *)0x0) {
      send_to_char((char *)in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8);
    }
    else if (local_1220->item_type == 10) {
      if (in_RDI->fighting == (CHAR_DATA *)0x0) {
        act((char *)in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8,in_stack_ffffffffffffece0,
            in_stack_ffffffffffffecd8,0);
        act((char *)in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8,in_stack_ffffffffffffece0,
            in_stack_ffffffffffffecd8,0);
        bVar1 = check_deny_magic(in_stack_ffffffffffffecd8);
        if (!bVar1) {
          in_stack_ffffffffffffed04 = local_1224;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed20,
                     (char *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                     in_stack_ffffffffffffed10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffed20,
                     (char *)CONCAT44(in_stack_ffffffffffffed1c,in_stack_ffffffffffffed18),
                     in_stack_ffffffffffffed10);
          CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>
                    (in_stack_ffffffffffffee50,in_stack_ffffffffffffee4c,in_stack_ffffffffffffee40,
                     in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,
                     in_stack_ffffffffffffee60,in_stack_ffffffffffffee68,in_stack_ffffffffffffee70,
                     in_stack_ffffffffffffee78);
          std::__cxx11::string::~string(local_12d0);
          std::allocator<char>::~allocator(&local_12d1);
          std::__cxx11::string::~string(local_12a8);
          std::allocator<char>::~allocator(&local_12a9);
        }
        extract_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00));
      }
      else {
        send_to_char((char *)in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8);
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffecf0,in_stack_ffffffffffffece8);
    }
  }
  return;
}

Assistant:

void do_quaff(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;
	int nDelay = 0;

	one_argument(argument, arg);

	if (!is_npc(ch)
		&& (ch->Class()->name == "necromancer" || ch->Class()->name == "sorcerer" || ch->Class()->name == "anti-paladin"))
	{
		nDelay = 1;
	}
	else
	{
		nDelay = 2;
	}

	/* Can quaff held potions, even in combat! -- Eladrian */

	if (arg[0] == '\0')
	{
		obj = get_eq_char(ch, WEAR_HOLD);

		if (obj != nullptr)
		{
			if (obj->item_type == ITEM_POTION)
			{
				act("$n quaffs $p in one large gulp.", ch, obj, nullptr, TO_ROOM);
				act("You quaff the contents of $p in one large gulp.", ch, obj, nullptr, TO_CHAR);
	
				if (!check_deny_magic(ch))
				{
					RS.Queue.AddToQueue(nDelay,
						"do_quaff",
						"quaff_potion",
						quaff_potion,
						ch,
						obj->value[0],
						obj->value[1],
						obj->value[2],
						obj->value[3]);
				}

				extract_obj(obj);
				return;
			}
		}

		send_to_char("Quaff what?\n\r", ch);
		return;
	}

	obj = get_obj_carry(ch, arg, ch);

	if (obj == nullptr)
	{
		send_to_char("You do not have that potion.\n\r", ch);
		return;
	}

	if (obj->item_type != ITEM_POTION)
	{
		send_to_char("You can quaff only potions.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("You're too busy fighting to quaff.\n\r", ch);
		return;
	}

	act("$n quaffs $p in one large gulp.", ch, obj, nullptr, TO_ROOM);
	act("You quaff the contents of $p in one large gulp.", ch, obj, nullptr, TO_CHAR);

	if (!check_deny_magic(ch))
	{
		RS.Queue.AddToQueue(nDelay,
			"do_quaff",
			"quaff_potion",
			quaff_potion,
			ch,
			obj->value[0],
			obj->value[1],
			obj->value[2],
			obj->value[3]);
	}

	extract_obj(obj);
}